

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff_expr.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ostream *poVar6;
  bool tx_36;
  bool tx_35;
  bool tx_34;
  bool tx_33;
  bool tx_32;
  bool tx_31;
  bool tx_30;
  bool tx_29;
  bool tx_28;
  bool tx_27;
  bool tx_26;
  bool tx_25;
  bool tx_24;
  bool tx_23;
  bool tx_22;
  bool tx_21;
  bool tx_20;
  bool tx_19;
  bool tx_18;
  bool tx_17;
  bool tx_16;
  bool tx_15;
  bool tx_14;
  bool tx_13;
  bool tx_12;
  bool tx_11;
  bool tx_10;
  bool tx_9;
  bool tx_8;
  bool tx_7;
  bool tx_6;
  bool tx_5;
  bool tx_4;
  bool tx_3;
  bool tx_2;
  bool tx_1;
  bool tx;
  char *_tname;
  int _fail;
  undefined7 in_stack_fffffffffffff060;
  undefined1 in_stack_fffffffffffff067;
  string *in_stack_fffffffffffff068;
  Environment *in_stack_fffffffffffff070;
  allocator<char> *in_stack_fffffffffffff080;
  allocator<char> *__a;
  char *in_stack_fffffffffffff088;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffff090;
  undefined1 in_stack_fffffffffffff097;
  undefined8 in_stack_fffffffffffff0b8;
  undefined1 mode_explicit;
  undefined7 in_stack_fffffffffffff0c0;
  undefined1 in_stack_fffffffffffff0c7;
  Environment *in_stack_fffffffffffff0c8;
  undefined7 in_stack_fffffffffffff158;
  undefined1 in_stack_fffffffffffff15f;
  double in_stack_fffffffffffff160;
  allocator<char> *xmin;
  undefined8 in_stack_fffffffffffff168;
  uint32_t uVar7;
  undefined7 in_stack_fffffffffffff170;
  undefined1 in_stack_fffffffffffff177;
  string *in_stack_fffffffffffff178;
  string *str;
  allocator<char> local_c21;
  string local_c20 [39];
  allocator<char> local_bf9;
  string local_bf8 [38];
  byte local_bd2;
  allocator<char> local_bd1;
  string local_bd0 [39];
  allocator<char> local_ba9;
  string local_ba8 [38];
  byte local_b82;
  allocator<char> local_b81;
  string local_b80 [39];
  allocator<char> local_b59;
  string local_b58 [38];
  byte local_b32;
  allocator<char> local_b31;
  string local_b30 [39];
  allocator<char> local_b09;
  string local_b08 [38];
  byte local_ae2;
  allocator<char> local_ae1;
  string local_ae0 [39];
  allocator<char> local_ab9;
  string local_ab8 [38];
  byte local_a92;
  allocator<char> local_a91;
  string local_a90 [39];
  allocator<char> local_a69;
  string local_a68 [38];
  byte local_a42;
  allocator<char> local_a41;
  string local_a40 [39];
  allocator<char> local_a19;
  string local_a18 [38];
  byte local_9f2;
  allocator<char> local_9f1;
  string local_9f0 [39];
  allocator<char> local_9c9;
  string local_9c8 [38];
  byte local_9a2;
  allocator<char> local_9a1;
  string local_9a0 [39];
  allocator<char> local_979;
  string local_978 [38];
  byte local_952;
  allocator<char> local_951;
  string local_950 [39];
  allocator<char> local_929;
  string local_928 [38];
  byte local_902;
  allocator<char> local_901;
  string local_900 [39];
  allocator<char> local_8d9;
  string local_8d8 [39];
  allocator<char> local_8b1;
  string local_8b0 [38];
  byte local_88a;
  allocator<char> local_889;
  string local_888 [39];
  allocator<char> local_861;
  string local_860 [38];
  byte local_83a;
  undefined1 local_839 [40];
  allocator<char> local_811;
  string local_810 [38];
  byte local_7ea;
  allocator<char> local_7e9;
  string local_7e8 [39];
  allocator<char> local_7c1;
  string local_7c0 [38];
  byte local_79a;
  allocator<char> local_799;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [38];
  byte local_74a;
  allocator<char> local_749;
  string local_748 [39];
  allocator<char> local_721;
  string local_720 [38];
  byte local_6fa;
  allocator<char> local_6f9;
  string local_6f8 [39];
  allocator<char> local_6d1;
  string local_6d0 [38];
  byte local_6aa;
  allocator<char> local_6a9;
  string local_6a8 [39];
  allocator<char> local_681;
  string local_680 [38];
  byte local_65a;
  allocator<char> local_659;
  string local_658 [39];
  allocator<char> local_631;
  string local_630 [38];
  byte local_60a;
  allocator<char> local_609;
  string local_608 [39];
  allocator<char> local_5e1;
  string local_5e0 [38];
  byte local_5ba;
  allocator<char> local_5b9;
  string local_5b8 [39];
  allocator<char> local_591;
  string local_590 [38];
  byte local_56a;
  allocator<char> local_569;
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [38];
  byte local_51a;
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [38];
  byte local_4ca;
  allocator<char> local_4c9;
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0 [38];
  byte local_47a;
  allocator<char> local_479;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [38];
  byte local_42a;
  allocator<char> local_429;
  string local_428 [39];
  allocator<char> local_401;
  string local_400 [38];
  byte local_3da;
  allocator<char> local_3d9;
  string local_3d8 [39];
  allocator<char> local_3b1;
  string local_3b0 [38];
  byte local_38a;
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [38];
  byte local_33a;
  allocator<char> local_339;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [38];
  byte local_2ea;
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [38];
  byte local_29a;
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [38];
  byte local_24a;
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [38];
  byte local_1fa;
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [38];
  byte local_1aa;
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [38];
  byte local_15a;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [38];
  byte local_10a;
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [38];
  byte local_ba;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [38];
  byte local_6a;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  char *local_10;
  int local_8;
  uint local_4;
  
  uVar7 = (uint32_t)((ulong)in_stack_fffffffffffff168 >> 0x20);
  mode_explicit = (undefined1)((ulong)in_stack_fffffffffffff0b8 >> 0x38);
  local_4 = 0;
  local_8 = 0;
  local_10 = "test_diff_expr";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  nivalis::Environment::addr_of
            (in_stack_fffffffffffff0c8,
             (string *)CONCAT17(in_stack_fffffffffffff0c7,in_stack_fffffffffffff0c0),
             (bool)mode_explicit);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  nivalis::Environment::set
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,
             (double)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  local_6a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"nan\", \"nan\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_6a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2c);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  local_ba = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"e\", \"0\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_ba & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2d);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  local_10a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"a*x\", \"a\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_10a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2e);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  local_15a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"a^2*x^2\", \"2*a^2*x\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_15a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2f);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  local_1aa = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"x^3\", \"3*x^2\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_1aa & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x30);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  local_1fa = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"x^(-1)\", \"-1/x^2\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_1fa & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x31);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  local_24a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"1/x\", \"-x^(-2)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_24a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x32);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  local_29a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"x/(1+x)\", \"1/(1+x)^2\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_29a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x33);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  local_2ea = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"log(x)\", \"1/x\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_2ea & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x34);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  local_33a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"log2(x)\", \"1/(x*ln(2))\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_33a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x35);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  local_38a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"log(x,a)\", \"1/(x*ln(a))\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_38a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x36);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator(&local_401);
  local_3da = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"sin(x)\", \"cos(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_3da & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x37);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  local_42a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"cos(x)\", \"-sin(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_42a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x38);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  local_47a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"tan(x)\", \"1/cos(x)^2\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_47a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x39);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  local_4ca = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"arcsin(x)\", \"1/sqrt(1-x^2)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_4ca & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3a);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  local_51a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"arccos(x)\", \"-1/sqrt(1-x^2)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_51a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3b);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  local_56a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"arctan(x)\", \"1/(1+x^2)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_56a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3c);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  local_5ba = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"sinh(x)\", \"cosh(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_5ba & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3d);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  local_60a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"cosh(x)\", \"sinh(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_60a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3e);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  local_65a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"tanh(x)\", \"1-tanh(x)^2\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_65a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3f);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  local_6aa = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"sin(x)*cos(x)\", \"cos(x)^2-sin(x)^2\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_6aa & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x40);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  local_6fa = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"sin(x)^2\", \"2*sin(x)*cos(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_6fa & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x41);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  local_74a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"sin(cos(x))\", \"-cos(cos(x))*sin(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_74a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x42);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (in_stack_fffffffffffff178,
                     (string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),uVar7,
                     in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  local_79a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"exp(2*x)\", \"2*exp(2*x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_79a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x43);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  str = (string *)local_839;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar2 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(in_stack_fffffffffffff177,in_stack_fffffffffffff170),
                     uVar7,in_stack_fffffffffffff160,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string((string *)(local_839 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_839);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator(&local_811);
  local_7ea = bVar2 & 1;
  if (local_7ea == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"exp(abs(x))\", \"exp(abs(x))*sgn(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_7ea & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x44);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  uVar7 = (uint32_t)((ulong)&local_861 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  xmin = &local_889;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar3 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(in_stack_fffffffffffff15f,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  local_83a = bVar3 & 1;
  if (local_83a == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"exp2(-x)\", \"log(2)*-1*exp2(-x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_83a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x45);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  local_88a = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"3^(-x)\", \"ln(3)*-1*3^(-x)\", 0, -10.0, 10.0)"
                            );
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_88a & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x47);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  nivalis::Environment::set
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,
             (double)CONCAT17(in_stack_fffffffffffff067,in_stack_fffffffffffff060));
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator(&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator(&local_929);
  local_902 = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"a^(-x)\", \"ln(a)*-1*a^(-x)\", 0, -10.0, 10.0)"
                            );
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_902 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4a);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator(&local_979);
  local_952 = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"abs(x)\", \"sgn(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_952 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4b);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  local_9a2 = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"abs(x^2)\", \"2*x*(x!=0)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_9a2 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4c);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator(&local_a19);
  local_9f2 = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"sgn(x^2)\", \"0\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_9f2 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4d);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar4 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator(&local_a69);
  local_a42 = bVar4 & 1;
  if (local_a42 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"floor(x)\", \"0\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_a42 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4e);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  local_a92 = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,"test_derivative_random(\"choose(x,x/2)\", \"0\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_a92 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4f);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff097,in_stack_fffffffffffff090),in_stack_fffffffffffff088
             ,in_stack_fffffffffffff080);
  bVar4 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator(&local_b09);
  local_ae2 = bVar4 & 1;
  if (local_ae2 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"gamma(x)\", \"gamma(x)*digamma(x)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_ae2 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x50);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  __s = &local_b59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar4,in_stack_fffffffffffff090),(char *)__s,in_stack_fffffffffffff080);
  __a = &local_b81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar4,in_stack_fffffffffffff090),(char *)__s,__a);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator(&local_b81);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::~allocator(&local_b59);
  local_b32 = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"fact(x)\", \"gamma(x+1)*digamma(x+1)\", 0)");
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_b32 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x51);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar4,in_stack_fffffffffffff090),(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar4,in_stack_fffffffffffff090),(char *)__s,__a);
  bVar5 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  std::__cxx11::string::~string(local_ba8);
  std::allocator<char>::~allocator(&local_ba9);
  local_b82 = bVar5 & 1;
  if (local_b82 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"N(x)\", \"-1/(sqrt(2*pi))*exp(-0.5*x^2)*x\", 0, -2.0, 2.0)"
                            );
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_b82 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x53);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar4,in_stack_fffffffffffff090),(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar4,in_stack_fffffffffffff090),(char *)__s,__a);
  bVar1 = anon_unknown.dwarf_39d3::test_derivative_random
                    (str,(string *)CONCAT17(bVar2,in_stack_fffffffffffff170),uVar7,(double)xmin,
                     (double)CONCAT17(bVar3,in_stack_fffffffffffff158));
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator(&local_c21);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator(&local_bf9);
  local_bd2 = bVar1;
  if (!bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Assertion FAILED: \"");
    poVar6 = std::operator<<(poVar6,
                             "test_derivative_random(\"beta(x,x^2)\", \"beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + \" \"2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))\", 0)"
                            );
    poVar6 = std::operator<<(poVar6,"\" (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_bd2 & 1));
    poVar6 = std::operator<<(poVar6,")\n  at ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x56);
    std::operator<<(poVar6,"\n");
    local_8 = local_8 + 1;
  }
  bVar1 = local_8 != 0;
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,local_10);
    poVar6 = std::operator<<(poVar6,": ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_8);
    std::operator<<(poVar6," asserts FAILED\n");
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,local_10);
    std::operator<<(poVar6,": all passed\n");
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int main() {
    BEGIN_TEST(test_diff_expr);

    env.addr_of("x", false); env.set("a", 3.0);
    ASSERT(test_derivative_random("nan", "nan", 0));
    ASSERT(test_derivative_random("e", "0", 0));
    ASSERT(test_derivative_random("a*x", "a", 0));
    ASSERT(test_derivative_random("a^2*x^2", "2*a^2*x", 0));
    ASSERT(test_derivative_random("x^3", "3*x^2", 0));
    ASSERT(test_derivative_random("x^(-1)", "-1/x^2", 0));
    ASSERT(test_derivative_random("1/x", "-x^(-2)", 0));
    ASSERT(test_derivative_random("x/(1+x)", "1/(1+x)^2", 0));
    ASSERT(test_derivative_random("log(x)", "1/x", 0));
    ASSERT(test_derivative_random("log2(x)", "1/(x*ln(2))", 0));
    ASSERT(test_derivative_random("log(x,a)", "1/(x*ln(a))", 0));
    ASSERT(test_derivative_random("sin(x)", "cos(x)", 0));
    ASSERT(test_derivative_random("cos(x)", "-sin(x)", 0));
    ASSERT(test_derivative_random("tan(x)", "1/cos(x)^2", 0));
    ASSERT(test_derivative_random("arcsin(x)", "1/sqrt(1-x^2)", 0));
    ASSERT(test_derivative_random("arccos(x)", "-1/sqrt(1-x^2)", 0));
    ASSERT(test_derivative_random("arctan(x)", "1/(1+x^2)", 0));
    ASSERT(test_derivative_random("sinh(x)", "cosh(x)", 0));
    ASSERT(test_derivative_random("cosh(x)", "sinh(x)", 0));
    ASSERT(test_derivative_random("tanh(x)", "1-tanh(x)^2", 0));
    ASSERT(test_derivative_random("sin(x)*cos(x)", "cos(x)^2-sin(x)^2", 0));
    ASSERT(test_derivative_random("sin(x)^2", "2*sin(x)*cos(x)", 0));
    ASSERT(test_derivative_random("sin(cos(x))", "-cos(cos(x))*sin(x)", 0));
    ASSERT(test_derivative_random("exp(2*x)", "2*exp(2*x)", 0));
    ASSERT(test_derivative_random("exp(abs(x))", "exp(abs(x))*sgn(x)", 0));
    ASSERT(test_derivative_random("exp2(-x)", "log(2)*-1*exp2(-x)", 0));
    ASSERT(test_derivative_random("3^(-x)", "ln(3)*-1*3^(-x)", 0,
            -10.0, 10.0));
    env.set("a", 0.5);
    ASSERT(test_derivative_random("a^(-x)", "ln(a)*-1*a^(-x)", 0,
                -10.0, 10.0));
    ASSERT(test_derivative_random("abs(x)", "sgn(x)", 0));
    ASSERT(test_derivative_random("abs(x^2)", "2*x*(x!=0)", 0));
    ASSERT(test_derivative_random("sgn(x^2)", "0", 0));
    ASSERT(test_derivative_random("floor(x)", "0", 0));
    ASSERT(test_derivative_random("choose(x,x/2)", "0", 0));
    ASSERT(test_derivative_random("gamma(x)", "gamma(x)*digamma(x)", 0));
    ASSERT(test_derivative_random("fact(x)", "gamma(x+1)*digamma(x+1)", 0));
    ASSERT(test_derivative_random("N(x)", "-1/(sqrt(2*pi))*exp(-0.5*x^2)*x", 0,
                -2.0, 2.0));
    ASSERT(test_derivative_random("beta(x,x^2)",
                "beta(x,x^2)*(digamma(x) - digamma(x+x^2)) + "
                "2*x*beta(x,x^2)*(digamma(x^2) - digamma(x+x^2))", 0));

    END_TEST;
}